

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void flatbuffers::tests::anon_unknown_0::FixedLengthArrayTest(void)

{
  Offset<MyGame::Example::ArrayTable> OVar1;
  bool val;
  TestEnum TVar2;
  return_type rVar3;
  uint16_t uVar4;
  SizeT SVar5;
  return_type rVar6;
  int iVar7;
  return_type rVar8;
  size_t buffer_minalign;
  Array<int,_(unsigned_short)2> *pAVar9;
  Array<MyGame::Example::TestEnum,_(unsigned_short)2> *pAVar10;
  Array<long,_(unsigned_short)2> *pAVar11;
  Array<int,_(unsigned_short)15> *pAVar12;
  Array<MyGame::Example::NestedStruct,_(unsigned_short)2> *pAVar13;
  uint8_t *puVar14;
  return_type pNVar15;
  type pNVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar17;
  return_type rVar18;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *pvVar19;
  float expval;
  ulong local_2e8;
  size_t i_2;
  ArrayStruct *ap;
  char non_zero_memory [160];
  size_t arr_size;
  int local_220;
  int i_1;
  ArrayStruct *local_218;
  ArrayStruct *mArStruct;
  ArrayTable *p;
  Verifier verifier;
  int local_1b8;
  Offset<MyGame::Example::ArrayTable> aTable;
  undefined1 local_1b0 [4];
  int i;
  ArrayStruct aStruct;
  long local_108;
  TestEnum local_fa [2];
  int local_f8 [2];
  undefined1 local_f0 [8];
  NestedStruct nStruct1;
  long local_c8;
  TestEnum local_be [2];
  int local_bc [5];
  undefined1 local_a8 [8];
  NestedStruct nStruct0;
  FlatBufferBuilder fbb;
  
  buffer_minalign = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)(nStruct0.d_ + 1),0x400,(Allocator *)0x0,false,
             buffer_minalign);
  MyGame::Example::NestedStruct::NestedStruct((NestedStruct *)local_a8,B);
  pAVar9 = MyGame::Example::NestedStruct::mutable_a((NestedStruct *)local_a8);
  TestEq<bool,bool>(true,pAVar9 != (Array<int,_(unsigned_short)2> *)0x0,
                    "\'nullptr\' == \'nStruct0.mutable_a()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2b0,"");
  pAVar9 = MyGame::Example::NestedStruct::mutable_a((NestedStruct *)local_a8);
  local_bc[1] = 1;
  Array<int,_(unsigned_short)2>::Mutate(pAVar9,0,local_bc + 1);
  pAVar9 = MyGame::Example::NestedStruct::mutable_a((NestedStruct *)local_a8);
  local_bc[0] = 2;
  Array<int,_(unsigned_short)2>::Mutate(pAVar9,1,local_bc);
  pAVar10 = MyGame::Example::NestedStruct::mutable_c((NestedStruct *)local_a8);
  TestEq<bool,bool>(true,pAVar10 != (Array<MyGame::Example::TestEnum,_(unsigned_short)2> *)0x0,
                    "\'nullptr\' == \'nStruct0.mutable_c()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2b3,"");
  pAVar10 = MyGame::Example::NestedStruct::mutable_c((NestedStruct *)local_a8);
  local_be[1] = 2;
  Array<MyGame::Example::TestEnum,_(unsigned_short)2>::Mutate(pAVar10,0,local_be + 1);
  pAVar10 = MyGame::Example::NestedStruct::mutable_c((NestedStruct *)local_a8);
  local_be[0] = A;
  Array<MyGame::Example::TestEnum,_(unsigned_short)2>::Mutate(pAVar10,1,local_be);
  pAVar11 = MyGame::Example::NestedStruct::mutable_d((NestedStruct *)local_a8);
  TestEq<bool,bool>(true,pAVar11 != (Array<long,_(unsigned_short)2> *)0x0,
                    "\'nullptr\' == \'nStruct0.mutable_d()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2b6,"");
  pAVar11 = MyGame::Example::NestedStruct::mutable_d((NestedStruct *)local_a8);
  local_c8 = std::numeric_limits<long>::max();
  Array<long,_(unsigned_short)2>::Mutate(pAVar11,0,&local_c8);
  pAVar11 = MyGame::Example::NestedStruct::mutable_d((NestedStruct *)local_a8);
  nStruct1.d_[1] = std::numeric_limits<long>::min();
  Array<long,_(unsigned_short)2>::Mutate(pAVar11,1,nStruct1.d_ + 1);
  MyGame::Example::NestedStruct::NestedStruct((NestedStruct *)local_f0,C);
  pAVar9 = MyGame::Example::NestedStruct::mutable_a((NestedStruct *)local_f0);
  TestEq<bool,bool>(true,pAVar9 != (Array<int,_(unsigned_short)2> *)0x0,
                    "\'nullptr\' == \'nStruct1.mutable_a()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2ba,"");
  pAVar9 = MyGame::Example::NestedStruct::mutable_a((NestedStruct *)local_f0);
  local_f8[1] = 3;
  Array<int,_(unsigned_short)2>::Mutate(pAVar9,0,local_f8 + 1);
  pAVar9 = MyGame::Example::NestedStruct::mutable_a((NestedStruct *)local_f0);
  local_f8[0] = 4;
  Array<int,_(unsigned_short)2>::Mutate(pAVar9,1,local_f8);
  pAVar10 = MyGame::Example::NestedStruct::mutable_c((NestedStruct *)local_f0);
  TestEq<bool,bool>(true,pAVar10 != (Array<MyGame::Example::TestEnum,_(unsigned_short)2> *)0x0,
                    "\'nullptr\' == \'nStruct1.mutable_c()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2bd,"");
  pAVar10 = MyGame::Example::NestedStruct::mutable_c((NestedStruct *)local_f0);
  local_fa[1] = 2;
  Array<MyGame::Example::TestEnum,_(unsigned_short)2>::Mutate(pAVar10,0,local_fa + 1);
  pAVar10 = MyGame::Example::NestedStruct::mutable_c((NestedStruct *)local_f0);
  local_fa[0] = A;
  Array<MyGame::Example::TestEnum,_(unsigned_short)2>::Mutate(pAVar10,1,local_fa);
  pAVar11 = MyGame::Example::NestedStruct::mutable_d((NestedStruct *)local_f0);
  TestEq<bool,bool>(true,pAVar11 != (Array<long,_(unsigned_short)2> *)0x0,
                    "\'nullptr\' == \'nStruct1.mutable_d()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2c0,"");
  pAVar11 = MyGame::Example::NestedStruct::mutable_d((NestedStruct *)local_f0);
  local_108 = std::numeric_limits<long>::min();
  Array<long,_(unsigned_short)2>::Mutate(pAVar11,0,&local_108);
  pAVar11 = MyGame::Example::NestedStruct::mutable_d((NestedStruct *)local_f0);
  aStruct.f_[1] = std::numeric_limits<long>::max();
  Array<long,_(unsigned_short)2>::Mutate(pAVar11,1,aStruct.f_ + 1);
  MyGame::Example::ArrayStruct::ArrayStruct((ArrayStruct *)local_1b0,2.0,'\f',1);
  pAVar12 = MyGame::Example::ArrayStruct::b((ArrayStruct *)local_1b0);
  TestEq<bool,bool>(true,pAVar12 != (Array<int,_(unsigned_short)15> *)0x0,
                    "\'nullptr\' == \'aStruct.b()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2c4,"");
  pAVar12 = MyGame::Example::ArrayStruct::mutable_b((ArrayStruct *)local_1b0);
  TestEq<bool,bool>(true,pAVar12 != (Array<int,_(unsigned_short)15> *)0x0,
                    "\'nullptr\' == \'aStruct.mutable_b()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2c5,"");
  pAVar13 = MyGame::Example::ArrayStruct::mutable_d((ArrayStruct *)local_1b0);
  TestEq<bool,bool>(true,pAVar13 != (Array<MyGame::Example::NestedStruct,_(unsigned_short)2> *)0x0,
                    "\'nullptr\' == \'aStruct.mutable_d()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2c6,"");
  pAVar11 = MyGame::Example::ArrayStruct::mutable_f((ArrayStruct *)local_1b0);
  TestEq<bool,bool>(true,pAVar11 != (Array<long,_(unsigned_short)2> *)0x0,
                    "\'nullptr\' == \'aStruct.mutable_f()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2c7,"");
  aTable.o = 0;
  while( true ) {
    OVar1.o = aTable.o;
    pAVar12 = MyGame::Example::ArrayStruct::b((ArrayStruct *)local_1b0);
    uVar4 = Array<int,_(unsigned_short)15>::size(pAVar12);
    if ((int)(uint)uVar4 <= (int)OVar1.o) break;
    pAVar12 = MyGame::Example::ArrayStruct::mutable_b((ArrayStruct *)local_1b0);
    local_1b8 = aTable.o + 1;
    Array<int,_(unsigned_short)15>::Mutate(pAVar12,aTable.o,&local_1b8);
    aTable.o = aTable.o + 1;
  }
  pAVar13 = MyGame::Example::ArrayStruct::mutable_d((ArrayStruct *)local_1b0);
  Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Mutate
            (pAVar13,0,(NestedStruct *)local_a8);
  pAVar13 = MyGame::Example::ArrayStruct::mutable_d((ArrayStruct *)local_1b0);
  Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Mutate
            (pAVar13,1,(NestedStruct *)local_f0);
  verifier.flex_reuse_tracker_._0_4_ =
       MyGame::Example::CreateArrayTable
                 ((FlatBufferBuilder *)(nStruct0.d_ + 1),(ArrayStruct *)local_1b0);
  verifier.flex_reuse_tracker_._4_4_ = verifier.flex_reuse_tracker_._0_4_;
  MyGame::Example::FinishArrayTableBuffer
            ((FlatBufferBuilder *)(nStruct0.d_ + 1),verifier.flex_reuse_tracker_._0_4_);
  puVar14 = FlatBufferBuilderImpl<false>::GetBufferPointer
                      ((FlatBufferBuilderImpl<false> *)(nStruct0.d_ + 1));
  SVar5 = FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)(nStruct0.d_ + 1));
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)&p,puVar14,(ulong)SVar5,0x40,1000000,true);
  val = MyGame::Example::VerifyArrayTableBuffer((Verifier *)&p);
  TestEq<bool,bool>(true,val,"\'true\' != \'MyGame::Example::VerifyArrayTableBuffer(verifier)\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2d0,"");
  puVar14 = FlatBufferBuilderImpl<false>::GetBufferPointer
                      ((FlatBufferBuilderImpl<false> *)(nStruct0.d_ + 1));
  mArStruct = (ArrayStruct *)MyGame::Example::GetMutableArrayTable(puVar14);
  local_218 = MyGame::Example::ArrayTable::mutable_a((ArrayTable *)mArStruct);
  TestEq<bool,bool>(true,local_218 != (ArrayStruct *)0x0,"\'nullptr\' == \'mArStruct\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2d4,"");
  pAVar12 = MyGame::Example::ArrayStruct::b(local_218);
  TestEq<bool,bool>(true,pAVar12 != (Array<int,_(unsigned_short)15> *)0x0,
                    "\'nullptr\' == \'mArStruct->b()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2d5,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  TestEq<bool,bool>(true,pAVar13 != (Array<MyGame::Example::NestedStruct,_(unsigned_short)2> *)0x0,
                    "\'nullptr\' == \'mArStruct->d()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2d6,"");
  pAVar11 = MyGame::Example::ArrayStruct::f(local_218);
  TestEq<bool,bool>(true,pAVar11 != (Array<long,_(unsigned_short)2> *)0x0,
                    "\'nullptr\' == \'mArStruct->f()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2d7,"");
  pAVar12 = MyGame::Example::ArrayStruct::mutable_b(local_218);
  TestEq<bool,bool>(true,pAVar12 != (Array<int,_(unsigned_short)15> *)0x0,
                    "\'nullptr\' == \'mArStruct->mutable_b()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2d8,"");
  pAVar13 = MyGame::Example::ArrayStruct::mutable_d(local_218);
  TestEq<bool,bool>(true,pAVar13 != (Array<MyGame::Example::NestedStruct,_(unsigned_short)2> *)0x0,
                    "\'nullptr\' == \'mArStruct->mutable_d()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2d9,"");
  pAVar11 = MyGame::Example::ArrayStruct::mutable_f(local_218);
  TestEq<bool,bool>(true,pAVar11 != (Array<long,_(unsigned_short)2> *)0x0,
                    "\'nullptr\' == \'mArStruct->mutable_f()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2da,"");
  expval = MyGame::Example::ArrayStruct::a(local_218);
  TestEq<float,int>(expval,2,"\'mArStruct->a()\' != \'2\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2db,"");
  pAVar12 = MyGame::Example::ArrayStruct::b(local_218);
  uVar4 = Array<int,_(unsigned_short)15>::size(pAVar12);
  TestEq<unsigned_short,int>
            (uVar4,0xf,"\'mArStruct->b()->size()\' != \'15\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
             ,0x2dc,"");
  pAVar12 = MyGame::Example::ArrayStruct::mutable_b(local_218);
  i_1 = -0xe;
  Array<int,_(unsigned_short)15>::Mutate(pAVar12,0xe,&i_1);
  pAVar12 = MyGame::Example::ArrayStruct::b(local_218);
  rVar6 = Array<int,_(unsigned_short)15>::Get(pAVar12,0xe);
  pvVar19 = (void *)0xfffffff2;
  TestEq<int,int>(rVar6,-0xe,"\'mArStruct->b()->Get(14)\' != \'-14\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                  ,0x2de,"");
  iVar7 = MyGame::Example::ArrayStruct::c(local_218,pvVar19,extraout_RDX);
  TestEq<signed_char,int>
            ((char)iVar7,0xc,"\'mArStruct->c()\' != \'12\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
             ,0x2df,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,0);
  TestEq<bool,bool>(true,pNVar15 != (return_type)0x0,"\'nullptr\' == \'mArStruct->d()->Get(0)\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2e0,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,0);
  pAVar9 = MyGame::Example::NestedStruct::a(pNVar15);
  TestEq<bool,bool>(true,pAVar9 != (Array<int,_(unsigned_short)2> *)0x0,
                    "\'nullptr\' == \'mArStruct->d()->Get(0)->a()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2e1,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,0);
  pAVar9 = MyGame::Example::NestedStruct::a(pNVar15);
  rVar8 = Array<int,_(unsigned_short)2>::Get(pAVar9,0);
  TestEq<int,int>(rVar8,1,"\'mArStruct->d()->Get(0)->a()->Get(0)\' != \'1\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                  ,0x2e2,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,0);
  pAVar9 = MyGame::Example::NestedStruct::a(pNVar15);
  rVar8 = Array<int,_(unsigned_short)2>::Get(pAVar9,1);
  TestEq<int,int>(rVar8,2,"\'mArStruct->d()->Get(0)->a()->Get(1)\' != \'2\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                  ,0x2e3,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,1);
  TestEq<bool,bool>(true,pNVar15 != (return_type)0x0,"\'nullptr\' == \'mArStruct->d()->Get(1)\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2e4,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,1);
  pAVar9 = MyGame::Example::NestedStruct::a(pNVar15);
  TestEq<bool,bool>(true,pAVar9 != (Array<int,_(unsigned_short)2> *)0x0,
                    "\'nullptr\' == \'mArStruct->d()->Get(1)->a()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2e5,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,1);
  pAVar9 = MyGame::Example::NestedStruct::a(pNVar15);
  rVar8 = Array<int,_(unsigned_short)2>::Get(pAVar9,0);
  TestEq<int,int>(rVar8,3,"\'mArStruct->d()->Get(1)->a()->Get(0)\' != \'3\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                  ,0x2e6,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,1);
  pAVar9 = MyGame::Example::NestedStruct::a(pNVar15);
  rVar8 = Array<int,_(unsigned_short)2>::Get(pAVar9,1);
  TestEq<int,int>(rVar8,4,"\'mArStruct->d()->Get(1)->a()->Get(1)\' != \'4\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                  ,0x2e7,"");
  pAVar13 = MyGame::Example::ArrayStruct::mutable_d(local_218);
  pNVar16 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::GetMutablePointer(pAVar13,1);
  TestEq<bool,bool>(true,pNVar16 != (type)0x0,
                    "\'nullptr\' == \'mArStruct->mutable_d()->GetMutablePointer(1)\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2e8,"");
  pAVar13 = MyGame::Example::ArrayStruct::mutable_d(local_218);
  pNVar16 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::GetMutablePointer(pAVar13,1);
  pAVar9 = MyGame::Example::NestedStruct::mutable_a(pNVar16);
  TestEq<bool,bool>(true,pAVar9 != (Array<int,_(unsigned_short)2> *)0x0,
                    "\'nullptr\' == \'mArStruct->mutable_d()->GetMutablePointer(1)->mutable_a()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2e9,"");
  pAVar13 = MyGame::Example::ArrayStruct::mutable_d(local_218);
  pNVar16 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::GetMutablePointer(pAVar13,1);
  pAVar9 = MyGame::Example::NestedStruct::mutable_a(pNVar16);
  local_220 = 5;
  Array<int,_(unsigned_short)2>::Mutate(pAVar9,1,&local_220);
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,1);
  pAVar9 = MyGame::Example::NestedStruct::a(pNVar15);
  rVar8 = Array<int,_(unsigned_short)2>::Get(pAVar9,1);
  TestEq<int,int>(5,rVar8,"\'5\' != \'mArStruct->d()->Get(1)->a()->Get(1)\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                  ,0x2eb,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,0);
  TVar2 = MyGame::Example::NestedStruct::b(pNVar15);
  TestEq<MyGame::Example::TestEnum,MyGame::Example::TestEnum>
            (B,TVar2,"\'MyGame::Example::TestEnum::B\' != \'mArStruct->d()->Get(0)->b()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
             ,0x2ec,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pvVar19 = (void *)0x0;
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,0);
  iVar7 = MyGame::Example::NestedStruct::c(pNVar15,pvVar19,extraout_RDX_00);
  TestEq<bool,bool>(true,CONCAT44(extraout_var,iVar7) != 0,
                    "\'nullptr\' == \'mArStruct->d()->Get(0)->c()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2ed,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pvVar19 = (void *)0x0;
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,0);
  iVar7 = MyGame::Example::NestedStruct::c(pNVar15,pvVar19,extraout_RDX_01);
  rVar3 = Array<MyGame::Example::TestEnum,_(unsigned_short)2>::Get
                    ((Array<MyGame::Example::TestEnum,_(unsigned_short)2> *)
                     CONCAT44(extraout_var_00,iVar7),0);
  TestEq<MyGame::Example::TestEnum,MyGame::Example::TestEnum>
            (C,rVar3,"\'MyGame::Example::TestEnum::C\' != \'mArStruct->d()->Get(0)->c()->Get(0)\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
             ,0x2ee,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pvVar19 = (void *)0x0;
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,0);
  iVar7 = MyGame::Example::NestedStruct::c(pNVar15,pvVar19,extraout_RDX_02);
  rVar3 = Array<MyGame::Example::TestEnum,_(unsigned_short)2>::Get
                    ((Array<MyGame::Example::TestEnum,_(unsigned_short)2> *)
                     CONCAT44(extraout_var_01,iVar7),1);
  TestEq<MyGame::Example::TestEnum,MyGame::Example::TestEnum>
            (A,rVar3,"\'MyGame::Example::TestEnum::A\' != \'mArStruct->d()->Get(0)->c()->Get(1)\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
             ,0x2ef,"");
  lVar17 = std::numeric_limits<long>::max();
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,0);
  pAVar11 = MyGame::Example::NestedStruct::d(pNVar15);
  rVar18 = Array<long,_(unsigned_short)2>::Get(pAVar11,0);
  TestEq<long,long>(lVar17,rVar18,
                    "\'flatbuffers::numeric_limits<int64_t>::max()\' != \'mArStruct->d()->Get(0)->d()->Get(0)\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2f1,"");
  lVar17 = std::numeric_limits<long>::min();
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,0);
  pAVar11 = MyGame::Example::NestedStruct::d(pNVar15);
  rVar18 = Array<long,_(unsigned_short)2>::Get(pAVar11,1);
  TestEq<long,long>(lVar17,rVar18,
                    "\'flatbuffers::numeric_limits<int64_t>::min()\' != \'mArStruct->d()->Get(0)->d()->Get(1)\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2f3,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,1);
  TVar2 = MyGame::Example::NestedStruct::b(pNVar15);
  TestEq<MyGame::Example::TestEnum,MyGame::Example::TestEnum>
            (C,TVar2,"\'MyGame::Example::TestEnum::C\' != \'mArStruct->d()->Get(1)->b()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
             ,0x2f4,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pvVar19 = (void *)0x1;
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,1);
  iVar7 = MyGame::Example::NestedStruct::c(pNVar15,pvVar19,extraout_RDX_03);
  TestEq<bool,bool>(true,CONCAT44(extraout_var_02,iVar7) != 0,
                    "\'nullptr\' == \'mArStruct->d()->Get(1)->c()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2f5,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pvVar19 = (void *)0x1;
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,1);
  iVar7 = MyGame::Example::NestedStruct::c(pNVar15,pvVar19,extraout_RDX_04);
  rVar3 = Array<MyGame::Example::TestEnum,_(unsigned_short)2>::Get
                    ((Array<MyGame::Example::TestEnum,_(unsigned_short)2> *)
                     CONCAT44(extraout_var_03,iVar7),0);
  TestEq<MyGame::Example::TestEnum,MyGame::Example::TestEnum>
            (C,rVar3,"\'MyGame::Example::TestEnum::C\' != \'mArStruct->d()->Get(1)->c()->Get(0)\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
             ,0x2f6,"");
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pvVar19 = (void *)0x1;
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,1);
  iVar7 = MyGame::Example::NestedStruct::c(pNVar15,pvVar19,extraout_RDX_05);
  rVar3 = Array<MyGame::Example::TestEnum,_(unsigned_short)2>::Get
                    ((Array<MyGame::Example::TestEnum,_(unsigned_short)2> *)
                     CONCAT44(extraout_var_04,iVar7),1);
  TestEq<MyGame::Example::TestEnum,MyGame::Example::TestEnum>
            (A,rVar3,"\'MyGame::Example::TestEnum::A\' != \'mArStruct->d()->Get(1)->c()->Get(1)\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
             ,0x2f7,"");
  lVar17 = std::numeric_limits<long>::min();
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,1);
  pAVar11 = MyGame::Example::NestedStruct::d(pNVar15);
  rVar18 = Array<long,_(unsigned_short)2>::Get(pAVar11,0);
  TestEq<long,long>(lVar17,rVar18,
                    "\'flatbuffers::numeric_limits<int64_t>::min()\' != \'mArStruct->d()->Get(1)->d()->Get(0)\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2f9,"");
  lVar17 = std::numeric_limits<long>::max();
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  pNVar15 = Array<MyGame::Example::NestedStruct,_(unsigned_short)2>::Get(pAVar13,1);
  pAVar11 = MyGame::Example::NestedStruct::d(pNVar15);
  rVar18 = Array<long,_(unsigned_short)2>::Get(pAVar11,1);
  TestEq<long,long>(lVar17,rVar18,
                    "\'flatbuffers::numeric_limits<int64_t>::max()\' != \'mArStruct->d()->Get(1)->d()->Get(1)\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2fb,"");
  arr_size._4_4_ = 0;
  while( true ) {
    pAVar12 = MyGame::Example::ArrayStruct::b(local_218);
    uVar4 = Array<int,_(unsigned_short)15>::size(pAVar12);
    if ((int)(uVar4 - 1) <= (int)arr_size._4_4_) break;
    pAVar12 = MyGame::Example::ArrayStruct::b(local_218);
    rVar6 = Array<int,_(unsigned_short)15>::Get(pAVar12,arr_size._4_4_);
    TestEq<int,int>(rVar6,arr_size._4_4_ + 1,"\'mArStruct->b()->Get(i)\' != \'i + 1\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x2fd,"");
    arr_size._4_4_ = arr_size._4_4_ + 1;
  }
  pAVar13 = MyGame::Example::ArrayStruct::d(local_218);
  TestEq<int,unsigned_long>
            (0,(ulong)((uint)pAVar13 & 7),
             "\'0\' != \'reinterpret_cast<uintptr_t>(mArStruct->d()) % 8\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
             ,0x2ff,"");
  pAVar11 = MyGame::Example::ArrayStruct::f(local_218);
  TestEq<int,unsigned_long>
            (0,(ulong)((uint)pAVar11 & 7),
             "\'0\' != \'reinterpret_cast<uintptr_t>(mArStruct->f()) % 8\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
             ,0x300,"");
  builtin_strncpy(non_zero_memory + 0x88,
                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_strncpy(non_zero_memory + 0x78,
                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_strncpy(non_zero_memory + 0x68,
                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_strncpy(non_zero_memory + 0x58,
                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_strncpy(non_zero_memory + 0x48,
                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_strncpy(non_zero_memory + 0x38,
                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_strncpy(non_zero_memory + 0x28,
                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_strncpy(non_zero_memory + 0x18,
                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_strncpy(non_zero_memory + 8,
                  "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  ap = (ArrayStruct *)0x101010101010101;
  builtin_strncpy(non_zero_memory,"\x01\x01\x01\x01\x01\x01\x01\x01",8);
  MyGame::Example::ArrayStruct::ArrayStruct((ArrayStruct *)&ap);
  for (local_2e8 = 0; local_2e8 < 0xa0; local_2e8 = local_2e8 + 1) {
    TestEq<char,int>(non_zero_memory[local_2e8 - 8],0,"\'non_zero_memory[i]\' != \'0\'",
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                     ,0x311,"");
  }
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)(nStruct0.d_ + 1));
  return;
}

Assistant:

void FixedLengthArrayTest() {
  // Generate an ArrayTable containing one ArrayStruct.
  flatbuffers::FlatBufferBuilder fbb;
  MyGame::Example::NestedStruct nStruct0(MyGame::Example::TestEnum::B);
  TEST_NOTNULL(nStruct0.mutable_a());
  nStruct0.mutable_a()->Mutate(0, 1);
  nStruct0.mutable_a()->Mutate(1, 2);
  TEST_NOTNULL(nStruct0.mutable_c());
  nStruct0.mutable_c()->Mutate(0, MyGame::Example::TestEnum::C);
  nStruct0.mutable_c()->Mutate(1, MyGame::Example::TestEnum::A);
  TEST_NOTNULL(nStruct0.mutable_d());
  nStruct0.mutable_d()->Mutate(0, flatbuffers::numeric_limits<int64_t>::max());
  nStruct0.mutable_d()->Mutate(1, flatbuffers::numeric_limits<int64_t>::min());
  MyGame::Example::NestedStruct nStruct1(MyGame::Example::TestEnum::C);
  TEST_NOTNULL(nStruct1.mutable_a());
  nStruct1.mutable_a()->Mutate(0, 3);
  nStruct1.mutable_a()->Mutate(1, 4);
  TEST_NOTNULL(nStruct1.mutable_c());
  nStruct1.mutable_c()->Mutate(0, MyGame::Example::TestEnum::C);
  nStruct1.mutable_c()->Mutate(1, MyGame::Example::TestEnum::A);
  TEST_NOTNULL(nStruct1.mutable_d());
  nStruct1.mutable_d()->Mutate(0, flatbuffers::numeric_limits<int64_t>::min());
  nStruct1.mutable_d()->Mutate(1, flatbuffers::numeric_limits<int64_t>::max());
  MyGame::Example::ArrayStruct aStruct(2, 12, 1);
  TEST_NOTNULL(aStruct.b());
  TEST_NOTNULL(aStruct.mutable_b());
  TEST_NOTNULL(aStruct.mutable_d());
  TEST_NOTNULL(aStruct.mutable_f());
  for (int i = 0; i < aStruct.b()->size(); i++)
    aStruct.mutable_b()->Mutate(i, i + 1);
  aStruct.mutable_d()->Mutate(0, nStruct0);
  aStruct.mutable_d()->Mutate(1, nStruct1);
  auto aTable = MyGame::Example::CreateArrayTable(fbb, &aStruct);
  MyGame::Example::FinishArrayTableBuffer(fbb, aTable);
  // Verify correctness of the ArrayTable.
  flatbuffers::Verifier verifier(fbb.GetBufferPointer(), fbb.GetSize());
  TEST_ASSERT(MyGame::Example::VerifyArrayTableBuffer(verifier));
  // Do test.
  auto p = MyGame::Example::GetMutableArrayTable(fbb.GetBufferPointer());
  auto mArStruct = p->mutable_a();
  TEST_NOTNULL(mArStruct);
  TEST_NOTNULL(mArStruct->b());
  TEST_NOTNULL(mArStruct->d());
  TEST_NOTNULL(mArStruct->f());
  TEST_NOTNULL(mArStruct->mutable_b());
  TEST_NOTNULL(mArStruct->mutable_d());
  TEST_NOTNULL(mArStruct->mutable_f());
  TEST_EQ(mArStruct->a(), 2);
  TEST_EQ(mArStruct->b()->size(), 15);
  mArStruct->mutable_b()->Mutate(14, -14);
  TEST_EQ(mArStruct->b()->Get(14), -14);
  TEST_EQ(mArStruct->c(), 12);
  TEST_NOTNULL(mArStruct->d()->Get(0));
  TEST_NOTNULL(mArStruct->d()->Get(0)->a());
  TEST_EQ(mArStruct->d()->Get(0)->a()->Get(0), 1);
  TEST_EQ(mArStruct->d()->Get(0)->a()->Get(1), 2);
  TEST_NOTNULL(mArStruct->d()->Get(1));
  TEST_NOTNULL(mArStruct->d()->Get(1)->a());
  TEST_EQ(mArStruct->d()->Get(1)->a()->Get(0), 3);
  TEST_EQ(mArStruct->d()->Get(1)->a()->Get(1), 4);
  TEST_NOTNULL(mArStruct->mutable_d()->GetMutablePointer(1));
  TEST_NOTNULL(mArStruct->mutable_d()->GetMutablePointer(1)->mutable_a());
  mArStruct->mutable_d()->GetMutablePointer(1)->mutable_a()->Mutate(1, 5);
  TEST_EQ(5, mArStruct->d()->Get(1)->a()->Get(1));
  TEST_EQ(MyGame::Example::TestEnum::B, mArStruct->d()->Get(0)->b());
  TEST_NOTNULL(mArStruct->d()->Get(0)->c());
  TEST_EQ(MyGame::Example::TestEnum::C, mArStruct->d()->Get(0)->c()->Get(0));
  TEST_EQ(MyGame::Example::TestEnum::A, mArStruct->d()->Get(0)->c()->Get(1));
  TEST_EQ(flatbuffers::numeric_limits<int64_t>::max(),
          mArStruct->d()->Get(0)->d()->Get(0));
  TEST_EQ(flatbuffers::numeric_limits<int64_t>::min(),
          mArStruct->d()->Get(0)->d()->Get(1));
  TEST_EQ(MyGame::Example::TestEnum::C, mArStruct->d()->Get(1)->b());
  TEST_NOTNULL(mArStruct->d()->Get(1)->c());
  TEST_EQ(MyGame::Example::TestEnum::C, mArStruct->d()->Get(1)->c()->Get(0));
  TEST_EQ(MyGame::Example::TestEnum::A, mArStruct->d()->Get(1)->c()->Get(1));
  TEST_EQ(flatbuffers::numeric_limits<int64_t>::min(),
          mArStruct->d()->Get(1)->d()->Get(0));
  TEST_EQ(flatbuffers::numeric_limits<int64_t>::max(),
          mArStruct->d()->Get(1)->d()->Get(1));
  for (int i = 0; i < mArStruct->b()->size() - 1; i++)
    TEST_EQ(mArStruct->b()->Get(i), i + 1);
  // Check alignment
  TEST_EQ(0, reinterpret_cast<uintptr_t>(mArStruct->d()) % 8);
  TEST_EQ(0, reinterpret_cast<uintptr_t>(mArStruct->f()) % 8);

  // Check if default constructor set all memory zero
  const size_t arr_size = sizeof(MyGame::Example::ArrayStruct);
  char non_zero_memory[arr_size];
  // set memory chunk of size ArrayStruct to 1's
  std::memset(static_cast<void *>(non_zero_memory), 1, arr_size);
  // after placement-new it should be all 0's
#  if defined(_MSC_VER) && defined(_DEBUG)
#    undef new
#  endif
  MyGame::Example::ArrayStruct *ap =
      new (non_zero_memory) MyGame::Example::ArrayStruct;
#  if defined(_MSC_VER) && defined(_DEBUG)
#    define new DEBUG_NEW
#  endif
  (void)ap;
  for (size_t i = 0; i < arr_size; ++i) { TEST_EQ(non_zero_memory[i], 0); }
}